

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::Putc(XMLPrinter *this,char ch)

{
  char *pcVar1;
  
  if ((FILE *)this->_fp != (FILE *)0x0) {
    fputc((int)ch,(FILE *)this->_fp);
    return;
  }
  pcVar1 = DynArray<char,_20>::PushArr(&this->_buffer,1);
  pcVar1[-1] = ch;
  *pcVar1 = '\0';
  return;
}

Assistant:

void XMLPrinter::Putc( char ch )
{
    if ( _fp ) {
        fputc ( ch, _fp);
    }
    else {
        char* p = _buffer.PushArr( sizeof(char) ) - 1;   // back up over the null terminator.
        p[0] = ch;
        p[1] = 0;
    }
}